

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemoryRegionSection *
flatview_do_translate
          (MemoryRegionSection *__return_storage_ptr__,uc_struct_conflict15 *uc,FlatView *fv,
          hwaddr addr,hwaddr *xlat,hwaddr *plen_out,hwaddr *page_mask_out,_Bool is_write,
          _Bool is_mmio,AddressSpace **target_as,MemTxAttrs attrs)

{
  AddressSpaceDispatch *d;
  hwaddr local_58;
  hwaddr plen;
  IOMMUMemoryRegion *iommu_mr;
  MemoryRegionSection *section;
  _Bool is_mmio_local;
  hwaddr *phStack_38;
  _Bool is_write_local;
  hwaddr *plen_out_local;
  hwaddr *xlat_local;
  hwaddr addr_local;
  FlatView *fv_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  uc_local._4_4_ = attrs;
  section._7_1_ = is_write;
  section._6_1_ = is_mmio;
  local_58 = 0xffffffffffffffff;
  phStack_38 = plen_out;
  if (plen_out == (hwaddr *)0x0) {
    phStack_38 = &local_58;
  }
  plen_out_local = xlat;
  xlat_local = (hwaddr *)addr;
  addr_local = (hwaddr)fv;
  fv_local = (FlatView *)uc;
  d = flatview_to_dispatch(fv);
  iommu_mr = (IOMMUMemoryRegion *)
             address_space_translate_internal
                       (d,(hwaddr)xlat_local,plen_out_local,phStack_38,(_Bool)(section._6_1_ & 1));
  plen = (hwaddr)memory_region_get_iommu((MemoryRegion_conflict *)(iommu_mr->parent_obj).ops);
  if ((IOMMUMemoryRegion *)plen == (IOMMUMemoryRegion *)0x0) {
    if (page_mask_out != (hwaddr *)0x0) {
      *page_mask_out = 0x3fff;
    }
    memcpy(__return_storage_ptr__,iommu_mr,0x40);
  }
  else {
    address_space_translate_iommu
              (__return_storage_ptr__,(IOMMUMemoryRegion *)plen,plen_out_local,phStack_38,
               page_mask_out,(_Bool)(section._7_1_ & 1),(_Bool)(section._6_1_ & 1),target_as,
               uc_local._4_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

static MemoryRegionSection flatview_do_translate(struct uc_struct *uc, FlatView *fv,
                                                 hwaddr addr,
                                                 hwaddr *xlat,
                                                 hwaddr *plen_out,
                                                 hwaddr *page_mask_out,
                                                 bool is_write,
                                                 bool is_mmio,
                                                 AddressSpace **target_as,
                                                 MemTxAttrs attrs)
{
    MemoryRegionSection *section;
    IOMMUMemoryRegion *iommu_mr;
    hwaddr plen = (hwaddr)(-1);

    if (!plen_out) {
        plen_out = &plen;
    }

    section = address_space_translate_internal(
            flatview_to_dispatch(fv), addr, xlat,
            plen_out, is_mmio);

    iommu_mr = memory_region_get_iommu(section->mr);
    if (unlikely(iommu_mr)) {
        return address_space_translate_iommu(iommu_mr, xlat,
                                             plen_out, page_mask_out,
                                             is_write, is_mmio,
                                             target_as, attrs);
    }
    if (page_mask_out) {
        /* Not behind an IOMMU, use default page size. */
        *page_mask_out = ~TARGET_PAGE_MASK;
    }

    return *section;
}